

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O1

int Abc_NtkLevelReverse(Abc_Ntk_t *pNtk)

{
  uint *puVar1;
  ulong uVar2;
  int iVar3;
  Abc_Obj_t *pNode;
  uint uVar4;
  long lVar5;
  int *piVar6;
  Vec_Ptr_t *pVVar7;
  uint uVar8;
  int iVar9;
  
  pVVar7 = pNtk->vCos;
  if (0 < pVVar7->nSize) {
    lVar5 = 0;
    do {
      puVar1 = (uint *)((long)pVVar7->pArray[lVar5] + 0x14);
      *puVar1 = *puVar1 & 0xfff;
      lVar5 = lVar5 + 1;
      pVVar7 = pNtk->vCos;
    } while (lVar5 < pVVar7->nSize);
  }
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar3 = pNtk->vObjs->nSize;
    uVar2 = (long)iVar3 + 500;
    iVar9 = (int)uVar2;
    if ((pNtk->vTravIds).nCap < iVar9) {
      piVar6 = (int *)malloc(uVar2 * 4);
      (pNtk->vTravIds).pArray = piVar6;
      if (piVar6 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar9;
    }
    if (-500 < iVar3) {
      memset((pNtk->vTravIds).pArray,0,(uVar2 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar9;
  }
  iVar3 = pNtk->nTravIds;
  pNtk->nTravIds = iVar3 + 1;
  if (0x3ffffffe < iVar3) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pVVar7 = pNtk->vObjs;
  if (pVVar7->nSize < 1) {
    uVar8 = 0;
  }
  else {
    lVar5 = 0;
    uVar8 = 0;
    do {
      pNode = (Abc_Obj_t *)pVVar7->pArray[lVar5];
      if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
        Abc_NtkLevelReverse_rec(pNode);
        uVar4 = *(uint *)&pNode->field_0x14 >> 0xc;
        if (uVar8 <= uVar4) {
          uVar8 = uVar4;
        }
      }
      lVar5 = lVar5 + 1;
      pVVar7 = pNtk->vObjs;
    } while (lVar5 < pVVar7->nSize);
  }
  return uVar8;
}

Assistant:

int Abc_NtkLevelReverse( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i, LevelsMax;
    // set the CO levels to zero
    Abc_NtkForEachCo( pNtk, pNode, i )
        pNode->Level = 0;
    // perform the traversal
    LevelsMax = 0;
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        Abc_NtkLevelReverse_rec( pNode );
        if ( LevelsMax < (int)pNode->Level )
            LevelsMax = (int)pNode->Level;
    }
    return LevelsMax;
}